

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large_arithmetic.hpp
# Opt level: O0

div_t boost::random::detail::muldivmod(uintmax_t a,uintmax_t b,uintmax_t m)

{
  uint uVar1;
  div_t dVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int error;
  uintmax_t diff;
  uintmax_t rem;
  digit_t q;
  uintmax_t temp_1;
  int i_1;
  digit_t quotient [2];
  uint64_t temp;
  int j;
  digit_t carry;
  int i;
  digit_t m_ [2];
  digit_t b_ [2];
  digit_t a_ [2];
  digit_t product [4];
  int shift;
  div_t result;
  ulong local_b8;
  int local_ac;
  int local_84;
  uintmax_t local_80 [2];
  int local_6c;
  uint local_68;
  int local_64;
  uint local_58 [4];
  ulong local_48;
  uintmax_t local_40;
  int local_2c;
  ulong local_28;
  undefined8 local_20;
  long local_18;
  uintmax_t local_10;
  ulong local_8;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_2c = integer_log2<unsigned_long>(0xbac1bc);
  local_2c = 0x3f - local_2c;
  local_18 = local_18 << ((byte)local_2c & 0x3f);
  local_28 = local_28 << ((byte)local_2c & 0x3f);
  memset(&local_48,0,0x10);
  local_58[2] = (int)local_18;
  local_58[3] = (int)((ulong)local_18 >> 0x20);
  local_58[0] = (uint)local_20;
  local_58[1] = (int)((ulong)local_20 >> 0x20);
  uVar1 = (uint)(local_28 >> 0x20);
  for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
    local_68 = 0;
    for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
      lVar3 = (ulong)local_58[(long)local_64 + 2] * (ulong)local_58[local_6c] + (ulong)local_68 +
              (ulong)*(uint *)((long)&local_48 + (long)(local_64 + local_6c) * 4);
      *(int *)((long)&local_48 + (long)(local_64 + local_6c) * 4) = (int)lVar3;
      local_68 = (uint)((ulong)lVar3 >> 0x20);
    }
    if (local_68 != 0) {
      *(uint *)((long)&local_48 + (long)(local_64 + 2) * 4) =
           local_68 + *(int *)((long)&local_48 + (long)(local_64 + 2) * 4);
    }
  }
  if (local_28 == 0) {
    local_10 = local_40;
    local_8 = local_48 >> ((byte)local_2c & 0x3f);
  }
  else {
    for (local_84 = 3; 1 < local_84; local_84 = local_84 + -1) {
      uVar4 = CONCAT44(*(undefined4 *)((long)&local_48 + (long)local_84 * 4),
                       *(undefined4 *)((long)&local_48 + (long)(local_84 + -1) * 4));
      if (*(uint *)((long)&local_48 + (long)local_84 * 4) == uVar1) {
        local_b8 = 0xffffffff;
      }
      else {
        local_b8 = uVar4 / uVar1;
      }
      uVar4 = (uVar4 - (local_b8 & 0xffffffff) * (ulong)uVar1 << 0x20) +
              (ulong)*(uint *)((long)&local_48 + (long)(local_84 + -2) * 4);
      uVar5 = (local_28 & 0xffffffff) * (local_b8 & 0xffffffff);
      local_ac = 0;
      if (uVar4 < uVar5) {
        if (local_28 < uVar5 - uVar4) {
          local_ac = 2;
        }
        else {
          local_ac = 1;
        }
      }
      lVar3 = (uVar4 + (long)local_ac * local_28) - uVar5;
      *(int *)((long)local_80 + (long)(local_84 + -2) * 4) = (int)local_b8 - local_ac;
      *(undefined4 *)((long)&local_48 + (long)local_84 * 4) = 0;
      *(int *)((long)&local_48 + (long)(local_84 + -1) * 4) = (int)((ulong)lVar3 >> 0x20);
      *(int *)((long)&local_48 + (long)(local_84 + -2) * 4) = (int)lVar3;
    }
    local_10 = local_80[0];
    local_8 = local_48 >> ((byte)local_2c & 0x3f);
  }
  dVar2.remainder = local_8;
  dVar2.quotient = local_10;
  return dVar2;
}

Assistant:

inline div_t muldivmod(boost::uintmax_t a, boost::uintmax_t b, boost::uintmax_t m)
{
    static const int bits =
        ::std::numeric_limits< ::boost::uintmax_t>::digits / 2;
    static const ::boost::uintmax_t mask = (::boost::uintmax_t(1) << bits) - 1;
    typedef ::boost::uint_t<bits>::fast digit_t;

    int shift = std::numeric_limits< ::boost::uintmax_t>::digits - 1
        - detail::integer_log2(m);

    a <<= shift;
    m <<= shift;

    digit_t product[4] = { 0, 0, 0, 0 };
    digit_t a_[2] = { digit_t(a & mask), digit_t((a >> bits) & mask) };
    digit_t b_[2] = { digit_t(b & mask), digit_t((b >> bits) & mask) };
    digit_t m_[2] = { digit_t(m & mask), digit_t((m >> bits) & mask) };

    // multiply a * b
    for(int i = 0; i < 2; ++i) {
        digit_t carry = 0;
        for(int j = 0; j < 2; ++j) {
            ::boost::uint64_t temp = ::boost::uintmax_t(a_[i]) * b_[j] +
                carry + product[i + j];
            product[i + j] = digit_t(temp & mask);
            carry = digit_t(temp >> bits);
        }
        if(carry != 0) {
            product[i + 2] += carry;
        }
    }

    digit_t quotient[2];

    if(m == 0) {
        div_t result = {
            ((::boost::uintmax_t(product[3]) << bits) | product[2]),
            ((::boost::uintmax_t(product[1]) << bits) | product[0]) >> shift,
        };
        return result;
    }

    // divide product / m
    for(int i = 3; i >= 2; --i) {
        ::boost::uintmax_t temp =
            ::boost::uintmax_t(product[i]) << bits | product[i - 1];

        digit_t q = digit_t((product[i] == m_[1]) ? mask : temp / m_[1]);

        ::boost::uintmax_t rem =
            ((temp - ::boost::uintmax_t(q) * m_[1]) << bits) + product[i - 2];

        ::boost::uintmax_t diff = m_[0] * ::boost::uintmax_t(q);

        int error = 0;
        if(diff > rem) {
            if(diff - rem > m) {
                error = 2;
            } else {
                error = 1;
            }
        }
        q -= error;
        rem = rem + error * m - diff;

        quotient[i - 2] = q;
        product[i] = 0;
        product[i-1] = (rem >> bits) & mask;
        product[i-2] = rem & mask;
    }

    div_t result = {
        ((::boost::uintmax_t(quotient[1]) << bits) | quotient[0]),
        ((::boost::uintmax_t(product[1]) << bits) | product[0]) >> shift,
    };
    return result;
}